

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF32
          (BinaryWriterSpec *this,uint32_t f32_bits,ExpectedNan expected)

{
  ExpectedNan expected_local;
  uint32_t f32_bits_local;
  BinaryWriterSpec *this_local;
  
  if (expected == None) {
    Stream::Writef(this->json_stream_,"\"%u\"",(ulong)f32_bits);
  }
  else if (expected == Canonical) {
    WriteString(this,"nan:canonical");
  }
  else if (expected == Arithmetic) {
    WriteString(this,"nan:arithmetic");
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteF32(uint32_t f32_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%u\"", f32_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}